

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_439a3::TestTestMockPredicateBehavesCorrectly::RunImpl
          (TestTestMockPredicateBehavesCorrectly *this)

{
  TestResults *pTVar1;
  int iVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  Test fail;
  Test pass;
  TestDetails local_a0;
  Test local_80;
  Test local_48;
  
  UnitTest::Test::Test(&local_48,"pass","DefaultSuite","",0);
  UnitTest::Test::Test(&local_80,"fail","DefaultSuite","",0);
  iVar2 = strcmp(local_48.m_details.testName,"pass");
  if (iVar2 != 0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_a0,*ppTVar4,0x112);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_a0,"predicate(&pass)");
  }
  iVar2 = strcmp(local_80.m_details.testName,"pass");
  if (iVar2 == 0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_a0,*ppTVar4,0x113);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_a0,"!predicate(&fail)");
  }
  UnitTest::Test::~Test(&local_80);
  UnitTest::Test::~Test(&local_48);
  return;
}

Assistant:

TEST(TestMockPredicateBehavesCorrectly)
{
	RunTestIfNameIs predicate("pass");
	
	Test pass("pass");
	Test fail("fail");
	
	CHECK(predicate(&pass));
	CHECK(!predicate(&fail));	
}